

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::SetWritable
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  JavascriptLibrary *pJVar1;
  ScriptContext *scriptContext;
  code *pcVar2;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_01;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  int iVar6;
  PropertyId propertyId_00;
  undefined4 *puVar7;
  DynamicTypeHandler *pDVar8;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_48;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x7cd,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  local_40 = ScriptContext::GetPropertyName
                       ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  this_00 = (this->propertyMap).ptr;
  uVar4 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,&local_40);
  if ((int)uVar4 < 0) {
    bVar3 = DynamicObject::HasObjectArray(instance);
    iVar6 = 1;
    if ((bVar3) && (local_40->isNumeric == true)) {
      pDVar8 = ConvertToTypeWithItemAttributes(this,instance);
      iVar6 = (*pDVar8->_vptr_DynamicTypeHandler[0x2a])
                        (pDVar8,instance,(ulong)(uint)propertyId,(ulong)(uint)value);
    }
  }
  else {
    descriptor = (SimpleDictionaryPropertyDescriptor<unsigned_short> *)
                 ((this_00->entries).ptr + uVar4);
    iVar6 = 1;
    if ((descriptor->Attributes & 0x10) == 0) {
      propertyRecord = (PropertyRecord *)(instance->super_RecyclableObject).type.ptr;
      if (value == 0) {
        BVar5 = ClearAttribute(this,instance,descriptor,'\x04');
        if (BVar5 != 0) {
          DynamicObject::ChangeTypeIf(instance,(Type *)propertyRecord);
          pDVar8 = DynamicTypeHandler::GetCurrentTypeHandler(instance);
          pJVar1 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
          propertyRecord = (PropertyRecord *)&pJVar1->typesWithOnlyWritablePropertyProtoChain;
          Memory::Recycler::WBSetBit((char *)&local_48);
          local_48 = (PrototypeChainCache<Js::OnlyWritablePropertyCache> *)propertyRecord;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
          this_01 = local_48;
          scriptContext = (pJVar1->super_JavascriptLibraryBase).scriptContext.ptr;
          DynamicTypeHandler::SetHasOnlyWritableDataProperties(pDVar8,false);
          if ((pDVar8->flags & 0x20) != 0) {
            propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext,propertyId);
            ScriptContext::InvalidateStoreFieldCaches(scriptContext,propertyId_00);
            PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_01);
          }
        }
      }
      else {
        BVar5 = SetAttribute(this,instance,descriptor,'\x04');
        if (BVar5 != 0) {
          DynamicObject::ChangeTypeIf(instance,(Type *)propertyRecord);
        }
      }
    }
  }
  return iVar6;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetWritable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (!propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            // Upgrade type handler if set objectArray item attribute.
            // Only check numeric propertyId if objectArray available.
            if (instance->HasObjectArray() && propertyRecord->IsNumeric())
            {
                return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToTypeWithItemAttributes(instance)
                    ->SetWritable(instance, propertyId, value);
            }
            return true;
        }

        if (descriptor->Attributes & PropertyLetConstGlobal)
        {
            return true;
        }

        const Type* oldType = instance->GetType();
        if (value)
        {
            if (SetAttribute(instance, descriptor, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches
            }
        }
        else
        {
            if (ClearAttribute(instance, descriptor, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches

                // Clearing the attribute may have changed the type handler, so make sure
                // we access the current one.
                DynamicTypeHandler *const typeHandler = GetCurrentTypeHandler(instance);
                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(typeHandler, PropertyNone, propertyId, library->GetScriptContext());
            }
        }
        return true;
    }